

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
          (FabArray<amrex::FArrayBox> *this,int scomp,int ncomp,Periodicity *period,bool cross)

{
  IntVect *period_00;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  FabArray<amrex::FArrayBox> *in_RDI;
  undefined1 in_R8B;
  int r;
  int local_48;
  int local_44;
  undefined7 in_stack_ffffffffffffffd0;
  
  period_00 = &(in_RDI->super_FabArrayBase).n_grow;
  if ((in_RDI->super_FabArrayBase).n_grow.vect[1] < period_00->vect[0]) {
    local_44 = period_00->vect[0];
  }
  else {
    local_44 = (in_RDI->super_FabArrayBase).n_grow.vect[1];
  }
  if ((in_RDI->super_FabArrayBase).n_grow.vect[2] < local_44) {
    local_48 = local_44;
  }
  else {
    local_48 = (in_RDI->super_FabArrayBase).n_grow.vect[2];
  }
  if (0 < local_48) {
    FillBoundary_nowait<double>
              ((FabArray<amrex::FArrayBox> *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),
               (int)in_RCX,
               (IntVect *)(CONCAT17(in_R8B,in_stack_ffffffffffffffd0) & 0x1ffffffffffffff),
               (Periodicity *)period_00,SUB81((ulong)in_RDI >> 0x38,0));
    FillBoundary_finish<double,_amrex::FArrayBox,_0>(in_RDI);
  }
  return;
}

Assistant:

void
FabArray<FAB>::FillBoundary (int scomp, int ncomp, const Periodicity& period, bool cross)
{
    BL_PROFILE("FabArray::FillBoundary()");
    if ( n_grow.max() > 0 ) {
        FillBoundary_nowait<BUF>(scomp, ncomp, n_grow, period, cross);
        FillBoundary_finish<BUF>();
    }
}